

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext_conflict *pIVar2;
  ImGuiScrollFlags scroll_flags_00;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  int offset_local;
  
  pIVar2 = GImGui;
  ppIVar1 = &GImGui->CurrentWindow;
  if (-2 < offset) {
    GImGui->NavWindow = *ppIVar1;
    scroll_flags_00 = 3;
    if (((*ppIVar1)->Appearing & 1U) != 0) {
      scroll_flags_00 = 0x21;
    }
    NavMoveRequestSubmit(-1,-1,0x200,scroll_flags_00);
    if (offset == -1) {
      NavMoveRequestResolveWithLastItem();
    }
    else {
      pIVar2->NavTabbingInputableRemaining = offset + 1;
    }
    return;
  }
  __assert_fail("offset >= -1",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1e07,"void ImGui::SetKeyboardFocusHere(int)");
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    g.NavWindow = window;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, ImGuiDir_None, ImGuiNavMoveFlags_Tabbing, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
        NavMoveRequestResolveWithLastItem();
    else
        g.NavTabbingInputableRemaining = offset + 1;
}